

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t pax_attribute_SUN_holesdata
                  (archive_read *a,tar *tar,archive_entry *entry,char *p,size_t length)

{
  archive_entry *p_00;
  wchar_t wVar1;
  int64_t iVar2;
  char cVar3;
  char *pcVar4;
  long offset;
  archive_entry *paVar5;
  bool bVar6;
  uint local_3c;
  
  if ((p != (char *)0x0) && (*(char *)&entry->archive == ' ')) {
    local_3c = 1;
    offset = 0;
    do {
      p_00 = (archive_entry *)((long)&entry->archive + 1);
      pcVar4 = p + -1;
      bVar6 = pcVar4 == (char *)0x0;
      paVar5 = p_00;
      if ((!bVar6) && (cVar3 = *(char *)((long)&entry->archive + 1), cVar3 != ' ')) {
        do {
          if ((byte)(cVar3 - 0x3aU) < 0xf6) {
            return L'\xffffffec';
          }
          bVar6 = pcVar4 == (char *)0x1;
          if (bVar6) {
            pcVar4 = (char *)0x0;
            paVar5 = (archive_entry *)(p + (long)&entry->archive);
            break;
          }
          cVar3 = *(char *)((long)&paVar5->archive + 1);
          paVar5 = (archive_entry *)((long)&paVar5->archive + 1);
          pcVar4 = pcVar4 + -1;
        } while (cVar3 != ' ');
      }
      iVar2 = tar_atol_base_n((char *)p_00,(long)paVar5 - (long)p_00,L'\n');
      if (iVar2 < 0) {
        return L'\xffffffec';
      }
      if (iVar2 - offset != 0 && offset <= iVar2) {
        wVar1 = gnu_add_sparse_entry(a,tar,offset,iVar2 - offset);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        tar->sparse_last->hole = local_3c;
      }
      if (bVar6) {
        if (*(char *)&paVar5->archive != '\n') {
          return L'\xffffffec';
        }
        return L'\0';
      }
      local_3c = local_3c ^ 1;
      offset = iVar2;
      entry = paVar5;
      p = pcVar4;
    } while (*(char *)&paVar5->archive != '\n');
  }
  return L'\xffffffec';
}

Assistant:

static int
pax_attribute_SUN_holesdata(struct archive_read *a, struct tar *tar,
	struct archive_entry *entry, const char *p, size_t length)
{
	const char *e;
	int64_t start, end;
	int hole = 1;

	(void)entry; /* UNUSED */

	end = 0;
	if (length <= 0)
		return (ARCHIVE_WARN);
	if (*p == ' ') {
		p++;
		length--;
	} else {
		return (ARCHIVE_WARN);
	}
	for (;;) {
		e = p;
		while (length > 0 && *e != ' ') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
			length--;
		}
		start = end;
		end = tar_atol10(p, e - p);
		if (end < 0)
			return (ARCHIVE_WARN);
		if (start < end) {
			if (gnu_add_sparse_entry(a, tar, start,
			    end - start) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			tar->sparse_last->hole = hole;
		}
		if (length == 0 || *e == '\n') {
			if (length == 0 && *e == '\n') {
				return (ARCHIVE_OK);
			} else {
				return (ARCHIVE_WARN);
			}
		}
		p = e + 1;
		length--;
		hole = hole == 0;
	}
}